

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_encoder.hpp
# Opt level: O3

void __thiscall
jsoncons::
basic_json_encoder<char,_jsoncons::string_sink<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>
::new_line(basic_json_encoder<char,_jsoncons::string_sink<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>
           *this)

{
  pointer pcVar1;
  container_type *pcVar2;
  long *plVar3;
  int iVar4;
  int iVar5;
  size_type __pos;
  long *local_68 [2];
  long local_58 [2];
  long *local_48 [2];
  long local_38 [2];
  
  pcVar1 = (this->options_).new_line_chars_._M_dataplus._M_p;
  local_48[0] = local_38;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_48,pcVar1,pcVar1 + (this->options_).new_line_chars_._M_string_length);
  plVar3 = local_48[0];
  pcVar1 = (this->options_).new_line_chars_._M_dataplus._M_p;
  local_68[0] = local_58;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_68,pcVar1,pcVar1 + (this->options_).new_line_chars_._M_string_length);
  pcVar2 = (this->sink_).buf_ptr;
  std::__cxx11::string::replace((ulong)pcVar2,pcVar2->_M_string_length,(char *)0x0,(ulong)plVar3);
  if (local_68[0] != local_58) {
    operator_delete(local_68[0],local_58[0] + 1);
  }
  if (local_48[0] != local_38) {
    operator_delete(local_48[0],local_38[0] + 1);
  }
  iVar4 = this->indent_amount_;
  if (0 < iVar4) {
    iVar5 = 0;
    do {
      std::__cxx11::string::push_back((char)(this->sink_).buf_ptr);
      iVar5 = iVar5 + 1;
      iVar4 = this->indent_amount_;
    } while (iVar5 < iVar4);
  }
  this->column_ = (long)iVar4;
  return;
}

Assistant:

void new_line()
        {
            sink_.append(options_.new_line_chars().data(),options_.new_line_chars().length());
            for (int i = 0; i < indent_amount_; ++i)
            {
                sink_.push_back(' ');
            }
            column_ = indent_amount_;
        }